

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
                              super_IfcAnnotationOccurrence.super_IfcStyledItem + -0x18);
  puVar1 = (undefined8 *)
           (&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x0 + lVar3);
  pvVar2 = &this->field_0xc8 + lVar3;
  *(undefined8 *)((long)pvVar2 + -200) = 0x964f80;
  *(undefined8 *)((long)pvVar2 + 0x10) = 0x965070;
  *(undefined8 *)((long)pvVar2 + -0xb8) = 0x964fa8;
  *(undefined8 *)((long)pvVar2 + -0x58) = 0x964fd0;
  *(undefined8 *)((long)pvVar2 + -0x48) = 0x964ff8;
  *(undefined8 *)((long)pvVar2 + -0x38) = 0x965020;
  *(undefined8 *)((long)pvVar2 + -0x20) = 0x965048;
  if (*(void **)((long)pvVar2 + -0x10) != pvVar2) {
    operator_delete(*(void **)((long)pvVar2 + -0x10));
  }
  *puVar1 = 0x965428;
  puVar1[0x1b] = 0x965478;
  puVar1[2] = 0x965450;
  if ((undefined8 *)puVar1[9] != puVar1 + 0xb) {
    operator_delete((undefined8 *)puVar1[9]);
  }
  if ((void *)puVar1[6] != (void *)0x0) {
    operator_delete((void *)puVar1[6]);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}